

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O3

void sarimax_predict(sarimax_object obj,double *inp,double *xreg,int L,double *newxreg,double *xpred
                    ,double *amse)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int s;
  int d;
  int N;
  int D;
  double *pdVar5;
  uint ip;
  int iVar6;
  uint uVar7;
  long lVar8;
  double *C;
  double *C_00;
  double *oup;
  double *W;
  double *resid;
  double *phi;
  double *theta;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  double *pdVar12;
  ulong uVar13;
  double *pdVar14;
  long lVar15;
  double dVar16;
  double *local_c8;
  double local_38;
  
  uVar1 = obj->p;
  uVar2 = obj->q;
  uVar3 = obj->P;
  uVar4 = obj->Q;
  s = obj->s;
  lVar15 = (long)s;
  ip = s * uVar3 + uVar1;
  uVar9 = uVar4 * s + uVar2 + 1;
  if ((int)uVar9 < (int)ip) {
    uVar9 = ip;
  }
  d = obj->d;
  N = obj->N;
  lVar8 = (long)N;
  D = obj->D;
  C = (double *)malloc((long)d * 8 + 8);
  iVar6 = s * D;
  C_00 = (double *)malloc((long)iVar6 * 8 + 8);
  uVar7 = iVar6 + d + 1;
  oup = (double *)malloc((long)(int)uVar7 << 3);
  W = (double *)malloc(lVar8 * 8);
  resid = (double *)malloc(lVar8 * 8);
  phi = (double *)malloc((long)(int)uVar9 << 3);
  theta = (double *)malloc((long)(int)uVar9 << 3);
  *C_00 = 1.0;
  *C = 1.0;
  if (D == 0 && d == 0) {
    *oup = 1.0;
    local_38 = obj->mean;
  }
  else {
    if (0 < d) {
      deld(d,C);
    }
    local_38 = 0.0;
    if (0 < D) {
      delds(D,s,C_00);
    }
  }
  conv(C,d + 1,C_00,iVar6 + 1,oup);
  if (0 < iVar6 + d) {
    uVar10 = 1;
    do {
      oup[uVar10] = -oup[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar7 != uVar10);
  }
  if (0 < N) {
    uVar7 = obj->r;
    pdVar5 = obj->res;
    lVar11 = 0;
    local_c8 = xreg;
    do {
      dVar16 = inp[lVar11];
      if (D == 0 && d == 0) {
        dVar16 = dVar16 - local_38;
      }
      W[lVar11] = dVar16;
      if (0 < (int)uVar7) {
        pdVar14 = obj->exog;
        uVar10 = 0;
        pdVar12 = local_c8;
        do {
          dVar16 = dVar16 - pdVar14[uVar10] * *pdVar12;
          W[lVar11] = dVar16;
          uVar10 = uVar10 + 1;
          pdVar12 = pdVar12 + lVar8;
        } while (uVar7 != uVar10);
      }
      resid[lVar11] = pdVar5[lVar11];
      lVar11 = lVar11 + 1;
      local_c8 = local_c8 + 1;
    } while (lVar11 != lVar8);
  }
  if (0 < (int)uVar9) {
    memset(theta,0,(ulong)uVar9 << 3);
    memset(phi,0,(ulong)uVar9 << 3);
  }
  if (0 < (int)uVar1) {
    pdVar5 = obj->phi;
    uVar10 = 0;
    do {
      phi[uVar10] = pdVar5[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar1 != uVar10);
  }
  if (0 < (int)uVar2) {
    pdVar5 = obj->theta;
    uVar10 = 0;
    do {
      theta[uVar10] = -pdVar5[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar2 != uVar10);
  }
  if (0 < (int)uVar3) {
    pdVar5 = obj->PHI;
    uVar10 = 0;
    pdVar14 = phi;
    do {
      pdVar14 = pdVar14 + lVar15;
      dVar16 = pdVar5[uVar10];
      uVar10 = uVar10 + 1;
      phi[uVar10 * lVar15 + -1] = phi[uVar10 * lVar15 + -1] + dVar16;
      if (0 < (int)uVar1) {
        pdVar12 = obj->phi;
        uVar13 = 0;
        do {
          pdVar14[uVar13] = pdVar14[uVar13] - pdVar12[uVar13] * dVar16;
          uVar13 = uVar13 + 1;
        } while (uVar1 != uVar13);
      }
    } while (uVar10 != uVar3);
  }
  if (0 < (int)uVar4) {
    pdVar5 = obj->THETA;
    uVar10 = 0;
    pdVar14 = theta;
    do {
      pdVar14 = pdVar14 + lVar15;
      dVar16 = pdVar5[uVar10];
      uVar10 = uVar10 + 1;
      theta[uVar10 * lVar15 + -1] = theta[uVar10 * lVar15 + -1] - dVar16;
      if (0 < (int)uVar2) {
        pdVar12 = obj->theta;
        uVar13 = 0;
        do {
          pdVar14[uVar13] = pdVar12[uVar13] * dVar16 + pdVar14[uVar13];
          uVar13 = uVar13 + 1;
        } while (uVar2 != uVar13);
      }
    } while (uVar10 != uVar4);
  }
  forkal(ip,uVar4 * s + uVar2,iVar6 + d,phi,theta,oup + 1,N,W,resid,L,xpred,amse);
  if (0 < L) {
    uVar1 = obj->r;
    uVar10 = 0;
    do {
      dVar16 = xpred[uVar10] + local_38;
      xpred[uVar10] = dVar16;
      if (0 < (int)uVar1) {
        pdVar5 = obj->exog;
        uVar13 = 0;
        pdVar14 = newxreg;
        do {
          dVar16 = dVar16 + pdVar5[uVar13] * *pdVar14;
          xpred[uVar10] = dVar16;
          uVar13 = uVar13 + 1;
          pdVar14 = pdVar14 + (uint)L;
        } while (uVar1 != uVar13);
      }
      uVar10 = uVar10 + 1;
      newxreg = newxreg + 1;
    } while (uVar10 != (uint)L);
  }
  free(C);
  free(C_00);
  free(oup);
  free(W);
  free(resid);
  free(phi);
  free(theta);
  return;
}

Assistant:

void sarimax_predict(sarimax_object obj, double *inp, double *xreg, int L,double *newxreg, double *xpred, double *amse) {
	int d, i, N, ip, iq, ir,D,P,Q,s,p,q,t,ps,qs,j;
	double *coef1,*coef2,*delta, *W, *resid, *phi, *theta;
	double wmean;

	d = obj->d;
	N = obj->N;
	p = obj->p;
	q = obj->q;
	D = obj->D;
	P = obj->P;
	Q = obj->Q;
	s = obj->s;

	ip = p + s * P;
	iq = q + s * Q;
	ir = p + s * P;

	t = 1 + q + s*Q;
	if (ir < t) {
		ir = t;
	}
	ps = P;
	qs = Q;
	coef1 = (double*)malloc(sizeof(double)* (d + 1));
	coef2 = (double*)malloc(sizeof(double)* (D*s + 1));
	delta = (double*)malloc(sizeof(double)* (d + D*s + 1));
	W = (double*)malloc(sizeof(double)* N);
	resid = (double*)malloc(sizeof(double)* N);


	phi = (double*)malloc(sizeof(double)* ir);
	theta = (double*)malloc(sizeof(double)* ir);
	wmean = 0.0;
	coef1[0] = coef2[0] = 1.0;

	if (d == 0 && D == 0) {
		*delta = 1.0;
		wmean = obj->mean;
	}

	if (d > 0) {
		deld(d, coef1);
	}

	if (D > 0) {
		delds(D, s, coef2);
	}

	conv(coef1, d + 1, coef2, D*s + 1, delta);
	
	for (i = 1; i <= d+D*s; ++i) {
		delta[i] = -1.0 * delta[i];
	}
	for (i = 0; i < N; ++i) {
		W[i] = inp[i];
		if (d == 0 && D == 0) {
			W[i] -= wmean;
		}
		if (obj->r > 0) {
			for(j = 0; j < obj->r;++j) {
				W[i] -= obj->exog[j] * xreg[j*N+i];
			}
		}
		resid[i] = obj->res[i];
	}
	for (i = 0; i < ir; ++i) {
		phi[i] = theta[i] = 0.0;
	}

	for (i = 0; i < p; ++i) {
		phi[i] = obj->phi[i];
	}

	for (i = 0; i < q; ++i) {
		theta[i] = -1.0 *  obj->theta[i];
	}

	for (j = 0; j < ps; ++j) {
		phi[(j + 1)*s - 1] += obj->PHI[j];
		for (i = 0; i < p; ++i) {
			phi[(j + 1)*s + i] -= obj->phi[i] * obj->PHI[j];
		}
	}

	for (j = 0; j < qs; ++j) {
		theta[(j + 1)*s - 1] -= obj->THETA[j];
		for (i = 0; i < q; ++i) {
			theta[(j + 1)*s + i] += obj->theta[i] * obj->THETA[j];
		}
	}

	forkal(ip, iq, d+D*s, phi, theta, delta + 1, N, W, resid, L, xpred, amse);

	for (i = 0; i < L; ++i) {
		xpred[i] += wmean;
		for(j = 0; j < obj->r;++j) {
			xpred[i] += obj->exog[j] * newxreg[j*L+i];
		}
	}

	free(coef1);
	free(coef2);
	free(delta);
	free(W);
	free(resid);
	free(phi);
	free(theta);
}